

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O3

void player_safe_name(char *safe,size_t safelen,char *name,_Bool strip_suffix)

{
  char *pcVar1;
  ushort **ppuVar2;
  byte bVar3;
  char *pcVar4;
  
  if (name == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = find_roman_suffix_start(name);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = (char *)strlen(name);
    }
    else {
      pcVar1 = pcVar1 + ~(ulong)name;
    }
  }
  if (safelen <= pcVar1) {
    pcVar1 = (char *)safelen;
  }
  if (pcVar1 != (char *)0x0) {
    pcVar4 = (char *)0x0;
    ppuVar2 = __ctype_b_loc();
    do {
      bVar3 = 0x5f;
      if (((*ppuVar2)[(byte)name[(long)pcVar4]] & 0xc00) != 0) {
        bVar3 = name[(long)pcVar4];
      }
      safe[(long)pcVar4] = bVar3;
      pcVar4 = pcVar4 + 1;
    } while (pcVar1 != pcVar4);
  }
  safe[(long)pcVar1] = '\0';
  if (*safe != '\0') {
    return;
  }
  my_strcpy(safe,"PLAYER",safelen);
  return;
}

Assistant:

void player_safe_name(char *safe, size_t safelen, const char *name, bool strip_suffix)
{
	size_t i;
	size_t limit = 0;

	if (name) {
		char *suffix = find_roman_suffix_start(name);

		if (suffix) {
			limit = suffix - name - 1; /* -1 for preceding space */
		} else {
			limit = strlen(name);
		}
	}

	/* Limit to maximum size of safename buffer */
	limit = MIN(limit, safelen);

	for (i = 0; i < limit; i++) {
		char c = name[i];

		/* Convert all non-alphanumeric symbols */
		if (!isalpha((unsigned char)c) && !isdigit((unsigned char)c))
			c = '_';

		/* Build "base_name" */
		safe[i] = c;
	}

	/* Terminate */
	safe[i] = '\0';

	/* Require a "base" name */
	if (!safe[0])
		my_strcpy(safe, "PLAYER", safelen);
}